

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_if(LexState *ls,BCLine line)

{
  FuncState *fs_00;
  BCPos BVar1;
  BCPos local_28;
  BCPos local_24;
  BCPos escapelist;
  BCPos flist;
  FuncState *fs;
  LexState *pLStack_10;
  BCLine line_local;
  LexState *ls_local;
  
  _escapelist = ls->fs;
  local_28 = 0xffffffff;
  fs._4_4_ = line;
  pLStack_10 = ls;
  local_24 = parse_then(ls);
  while (fs_00 = _escapelist, pLStack_10->tok == 0x105) {
    BVar1 = bcemit_jmp(_escapelist);
    jmp_append(fs_00,&local_28,BVar1);
    jmp_tohere(_escapelist,local_24);
    local_24 = parse_then(pLStack_10);
  }
  if (pLStack_10->tok == 0x104) {
    BVar1 = bcemit_jmp(_escapelist);
    jmp_append(fs_00,&local_28,BVar1);
    jmp_tohere(_escapelist,local_24);
    lj_lex_next(pLStack_10);
    parse_block(pLStack_10);
  }
  else {
    jmp_append(_escapelist,&local_28,local_24);
  }
  jmp_tohere(_escapelist,local_28);
  lex_match(pLStack_10,0x106,0x10b,fs._4_4_);
  return;
}

Assistant:

static void parse_if(LexState *ls, BCLine line)
{
  FuncState *fs = ls->fs;
  BCPos flist;
  BCPos escapelist = NO_JMP;
  flist = parse_then(ls);
  while (ls->tok == TK_elseif) {  /* Parse multiple 'elseif' blocks. */
    jmp_append(fs, &escapelist, bcemit_jmp(fs));
    jmp_tohere(fs, flist);
    flist = parse_then(ls);
  }
  if (ls->tok == TK_else) {  /* Parse optional 'else' block. */
    jmp_append(fs, &escapelist, bcemit_jmp(fs));
    jmp_tohere(fs, flist);
    lj_lex_next(ls);  /* Skip 'else'. */
    parse_block(ls);
  } else {
    jmp_append(fs, &escapelist, flist);
  }
  jmp_tohere(fs, escapelist);
  lex_match(ls, TK_end, TK_if, line);
}